

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseSafe(Parser *this)

{
  bool bVar1;
  TokenType TVar2;
  ExprType EVar3;
  Token *this_00;
  Position *pPVar4;
  pointer pEVar5;
  type pEVar6;
  UnOpExpr *this_01;
  BiOpExpr *this_02;
  Parser *in_RSI;
  undefined1 local_90 [24];
  undefined1 local_78 [8];
  undefined1 local_70 [8];
  undefined1 local_68 [8];
  Position local_60;
  undefined4 local_44;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  Position pos;
  Parser *this_local;
  
  this_00 = Lexer::getCurrentToken(in_RSI->lexer);
  pPVar4 = Token::getPosition(this_00);
  Position::Position((Position *)&expr,pPVar4);
  sanityExpect(in_RSI,TOK_KW_SAFE);
  parseExpression((Parser *)&stack0xffffffffffffffc0,(Precedence)in_RSI);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xffffffffffffffc0);
  if (!bVar1) {
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<std::default_delete<pfederc::Expr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0);
    goto LAB_0011f2c6;
  }
  pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                     ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                      &stack0xffffffffffffffc0);
  pPVar4 = Expr::getPosition(pEVar5);
  Position::operator+(&local_60,(Position *)&expr,pPVar4);
  expr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
       (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)local_60.line
  ;
  pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                     ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                      &stack0xffffffffffffffc0);
  EVar3 = Expr::getType(pEVar5);
  if (EVar3 == EXPR_BIOP) {
    pEVar6 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                       ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                        &stack0xffffffffffffffc0);
    this_02 = (BiOpExpr *)__dynamic_cast(pEVar6,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
    if (this_02 == (BiOpExpr *)0x0) {
      __cxa_bad_cast();
    }
    TVar2 = BiOpExpr::getOperatorType(this_02);
    if (TVar2 == TOK_OP_BRACKET_OPEN) {
      std::
      make_unique<pfederc::SafeExpr,pfederc::Lexer&,pfederc::Position&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                ((Lexer *)local_78,(Position *)in_RSI->lexer,&expr);
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<pfederc::SafeExpr,std::default_delete<pfederc::SafeExpr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                 (unique_ptr<pfederc::SafeExpr,_std::default_delete<pfederc::SafeExpr>_> *)local_78)
      ;
      std::unique_ptr<pfederc::SafeExpr,_std::default_delete<pfederc::SafeExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::SafeExpr,_std::default_delete<pfederc::SafeExpr>_> *)local_78)
      ;
      goto LAB_0011f2c6;
    }
  }
  else {
    if (EVar3 != EXPR_UNOP) {
      if (EVar3 - EXPR_ARRLIT < 3) {
        std::
        make_unique<pfederc::SafeExpr,pfederc::Lexer&,pfederc::Position&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                  ((Lexer *)local_68,(Position *)in_RSI->lexer,&expr);
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<pfederc::SafeExpr,std::default_delete<pfederc::SafeExpr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (unique_ptr<pfederc::SafeExpr,_std::default_delete<pfederc::SafeExpr>_> *)
                   local_68);
        std::unique_ptr<pfederc::SafeExpr,_std::default_delete<pfederc::SafeExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::SafeExpr,_std::default_delete<pfederc::SafeExpr>_> *)
                   local_68);
      }
      else {
        local_90._6_2_ = 2;
        local_90._0_4_ = 0x1e;
        pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            &stack0xffffffffffffffc0);
        Expr::getPosition(pEVar5);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_90 + 8),(SyntaxErrorCode *)(local_90 + 6),(Position *)local_90);
        generateError((Parser *)(local_90 + 0x10),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)in_RSI);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_90 + 0x10));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_90 + 8));
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<std::default_delete<pfederc::Expr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (nullptr_t)0x0);
      }
      goto LAB_0011f2c6;
    }
    pEVar6 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                       ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                        &stack0xffffffffffffffc0);
    this_01 = (UnOpExpr *)__dynamic_cast(pEVar6,&Expr::typeinfo,&UnOpExpr::typeinfo,0);
    if (this_01 == (UnOpExpr *)0x0) {
      __cxa_bad_cast();
    }
    TVar2 = UnOpExpr::getOperatorType(this_01);
    if (TVar2 == TOK_OP_BRACKET_OPEN) {
      std::
      make_unique<pfederc::SafeExpr,pfederc::Lexer&,pfederc::Position&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                ((Lexer *)local_70,(Position *)in_RSI->lexer,&expr);
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<pfederc::SafeExpr,std::default_delete<pfederc::SafeExpr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                 (unique_ptr<pfederc::SafeExpr,_std::default_delete<pfederc::SafeExpr>_> *)local_70)
      ;
      std::unique_ptr<pfederc::SafeExpr,_std::default_delete<pfederc::SafeExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::SafeExpr,_std::default_delete<pfederc::SafeExpr>_> *)local_70)
      ;
      goto LAB_0011f2c6;
    }
  }
  std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
  unique_ptr<std::default_delete<pfederc::Expr>,void>
            ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0);
LAB_0011f2c6:
  local_44 = 1;
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
            ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
             &stack0xffffffffffffffc0);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseSafe() noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_KW_SAFE);

  std::unique_ptr<Expr> expr(parseExpression());

  if (!expr)
    return nullptr;

  pos = pos + expr->getPosition();

  switch (expr->getType()) {
	case ExprType::EXPR_ARRLIT:
  case ExprType::EXPR_ARRCPY:
  case ExprType::EXPR_ARREMPTY:
    return std::make_unique<SafeExpr>(lexer, pos, std::move(expr));
	case ExprType::EXPR_UNOP:
    if (dynamic_cast<const UnOpExpr&>(*expr).getOperatorType() == TokenType::TOK_OP_BRACKET_OPEN)
      return std::make_unique<SafeExpr>(lexer, pos, std::move(expr));
    break;
	case ExprType::EXPR_BIOP:
    if (dynamic_cast<const BiOpExpr&>(*expr).getOperatorType() == TokenType::TOK_OP_BRACKET_OPEN)
      return std::make_unique<SafeExpr>(lexer, pos, std::move(expr));
    break;
  default:
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_CONSTRUCTION,
      expr->getPosition()));
    return nullptr;
  }

  return nullptr;
}